

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O2

void __thiscall TCPConnection::StoreRxData(TCPConnection *this,DataBuffer *buffer)

{
  uint8_t uVar1;
  ushort uVar2;
  ushort uVar3;
  ulong uVar4;
  uint16_t uVar5;
  
  uVar2 = buffer->Length;
  uVar3 = this->CurrentWindow;
  if (uVar3 < uVar2) {
    printf("Rx window overrun, buffer %d, window %d\n",(ulong)uVar2);
    return;
  }
  uVar5 = this->RxInOffset;
  for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    uVar1 = buffer->Packet[uVar4];
    uVar2 = uVar5 + 1;
    this->RxInOffset = uVar2;
    this->RxBuffer[uVar5] = uVar1;
    uVar5 = uVar2;
    if (0xff < uVar2) {
      this->RxInOffset = 0;
      uVar5 = 0;
    }
    uVar2 = buffer->Length;
  }
  this->CurrentWindow = uVar3 - uVar2;
  this->RxBufferEmpty = false;
  return;
}

Assistant:

void TCPConnection::StoreRxData(DataBuffer* buffer)
{
    uint16_t i;

    if (buffer->Length > CurrentWindow)
    {
        printf("Rx window overrun, buffer %d, window %d\n", buffer->Length, CurrentWindow);
        return;
    }

    for (i = 0; i < buffer->Length; i++)
    {
        RxBuffer[RxInOffset++] = buffer->Packet[i];
        if (RxInOffset >= TCP_RX_WINDOW_SIZE)
        {
            RxInOffset = 0;
        }
    }
    CurrentWindow -= buffer->Length;
    RxBufferEmpty = false;
}